

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

bool IsKeyword(string *keyword)

{
  size_t __n;
  int iVar1;
  size_type *psVar2;
  ulong uVar3;
  bool bVar4;
  
  __n = keyword->_M_string_length;
  bVar4 = true;
  psVar2 = &KeyWord_abi_cxx11_[0]._M_string_length;
  uVar3 = 0;
  do {
    if (__n == *psVar2) {
      if (__n == 0) {
        return bVar4;
      }
      iVar1 = bcmp((keyword->_M_dataplus)._M_p,(((string *)(psVar2 + -1))->_M_dataplus)._M_p,__n);
      if (iVar1 == 0) {
        return bVar4;
      }
    }
    bVar4 = uVar3 < 9;
    uVar3 = uVar3 + 1;
    psVar2 = psVar2 + 4;
    if (uVar3 == 10) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool IsKeyword(string keyword) {
    //int length = KeyWord->size();  //Wrong!
    int length = sizeof(KeyWord) / sizeof(KeyWord[0]);
    for (int i = 0; i < length; i++) {
        if (keyword == KeyWord[i])
            return true;
    }
    return false;
}